

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionInfo::~AssertionInfo(AssertionInfo *this)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI + 0x48);
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1aa9ea);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

AssertionInfo() {}